

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

char * google::protobuf::compiler::java::FieldTypeName(Type field_type)

{
  int in_EDI;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  LogMessage *this;
  undefined8 in_stack_ffffffffffffff98;
  LogMessage local_48;
  char *local_8;
  
  switch((LogMessage *)(ulong)(in_EDI - 1)) {
  case (LogMessage *)0x0:
    local_8 = "DOUBLE";
    break;
  case (LogMessage *)0x1:
    local_8 = "FLOAT";
    break;
  case (LogMessage *)0x2:
    local_8 = "INT64";
    break;
  case (LogMessage *)0x3:
    local_8 = "UINT64";
    break;
  case (LogMessage *)0x4:
    local_8 = "INT32";
    break;
  case (LogMessage *)0x5:
    local_8 = "FIXED64";
    break;
  case (LogMessage *)0x6:
    local_8 = "FIXED32";
    break;
  case (LogMessage *)0x7:
    local_8 = "BOOL";
    break;
  case (LogMessage *)0x8:
    local_8 = "STRING";
    break;
  case (LogMessage *)0x9:
    local_8 = "GROUP";
    break;
  case (LogMessage *)0xa:
    local_8 = "MESSAGE";
    break;
  case (LogMessage *)0xb:
    local_8 = "BYTES";
    break;
  case (LogMessage *)0xc:
    local_8 = "UINT32";
    break;
  case (LogMessage *)0xd:
    local_8 = "ENUM";
    break;
  case (LogMessage *)0xe:
    local_8 = "SFIXED32";
    break;
  case (LogMessage *)0xf:
    local_8 = "SFIXED64";
    break;
  case (LogMessage *)0x10:
    local_8 = "SINT32";
    break;
  case (LogMessage *)0x11:
    local_8 = "SINT64";
    break;
  default:
    this = &local_48;
    internal::LogMessage::LogMessage
              ((LogMessage *)(ulong)(in_EDI - 1),
               (LogLevel)((ulong)in_stack_ffffffffffffff98 >> 0x20),(char *)this,
               in_stack_ffffffffffffff8c);
    internal::LogMessage::operator<<
              (this,(char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogFinisher::operator=
              ((LogFinisher *)this,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogMessage::~LogMessage((LogMessage *)0x45a435);
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char* FieldTypeName(FieldDescriptor::Type field_type) {
  switch (field_type) {
    case FieldDescriptor::TYPE_INT32:
      return "INT32";
    case FieldDescriptor::TYPE_UINT32:
      return "UINT32";
    case FieldDescriptor::TYPE_SINT32:
      return "SINT32";
    case FieldDescriptor::TYPE_FIXED32:
      return "FIXED32";
    case FieldDescriptor::TYPE_SFIXED32:
      return "SFIXED32";
    case FieldDescriptor::TYPE_INT64:
      return "INT64";
    case FieldDescriptor::TYPE_UINT64:
      return "UINT64";
    case FieldDescriptor::TYPE_SINT64:
      return "SINT64";
    case FieldDescriptor::TYPE_FIXED64:
      return "FIXED64";
    case FieldDescriptor::TYPE_SFIXED64:
      return "SFIXED64";
    case FieldDescriptor::TYPE_FLOAT:
      return "FLOAT";
    case FieldDescriptor::TYPE_DOUBLE:
      return "DOUBLE";
    case FieldDescriptor::TYPE_BOOL:
      return "BOOL";
    case FieldDescriptor::TYPE_STRING:
      return "STRING";
    case FieldDescriptor::TYPE_BYTES:
      return "BYTES";
    case FieldDescriptor::TYPE_ENUM:
      return "ENUM";
    case FieldDescriptor::TYPE_GROUP:
      return "GROUP";
    case FieldDescriptor::TYPE_MESSAGE:
      return "MESSAGE";

      // No default because we want the compiler to complain if any new
      // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}